

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
wabt::MakeUnique<wabt::TableImport>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true> in_RDI;
  string_view local_28;
  
  puVar1 = (undefined8 *)operator_new(0x90);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = puVar1 + 7;
  puVar1[6] = 0;
  *(undefined1 *)(puVar1 + 7) = 0;
  *(undefined4 *)(puVar1 + 9) = 1;
  *puVar1 = &PTR__TableImport_0019f900;
  local_28.data_ = (char *)0x0;
  local_28.size_ = 0;
  string_view::to_string_abi_cxx11_((string *)(puVar1 + 10),&local_28);
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  *(undefined2 *)(puVar1 + 0x10) = 0;
  *(undefined4 *)(puVar1 + 0x11) = 0xfffffff0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
   super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
   super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl = puVar1;
  return (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         (tuple<wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
         super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}